

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select_min.hpp
# Opt level: O0

__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
burst::
select_min<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<void>>
          (int *first,int *last)

{
  bool bVar1;
  reference piVar2;
  reference piVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *p_Var4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> current;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> min;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first_local;
  
  local_20._M_current = last;
  last_local._M_current = first;
  bVar1 = __gnu_cxx::operator!=(&last_local,&local_20);
  if (bVar1) {
    current = last_local;
    local_38 = std::next<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                         (last_local,1);
    while (bVar1 = __gnu_cxx::operator!=(&local_38,&local_20), bVar1) {
      piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_38);
      piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&current);
      bVar1 = (((std::forward<int&>)({parm#1}))<((std::forward<int&>)({parm#2})))std::less<void>::
              operator()((void *)((long)&min._M_current + 7),piVar2,piVar3);
      if (bVar1) {
        std::
        iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  (last_local,local_38);
        current = last_local;
      }
      else {
        piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&current);
        piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_38);
        bVar1 = (((std::forward<int&>)({parm#1}))<((std::forward<int&>)({parm#2})))std::less<void>::
                operator()((void *)((long)&min._M_current + 7),piVar2,piVar3);
        if (!bVar1) {
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&current);
          bVar1 = __gnu_cxx::operator!=(&current,&local_38);
          if (bVar1) {
            std::
            iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                      (current,local_38);
          }
        }
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_38);
    }
    p_Var4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator++(&current);
    first_local._M_current = p_Var4->_M_current;
  }
  else {
    first_local = last_local;
  }
  return (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)first_local._M_current;
}

Assistant:

auto select_min (ForwardIterator first, ForwardIterator last, BinaryPredicate compare)
    {
        if (first != last)
        {
            auto min = first;

            for (auto current = std::next(first); current != last; ++current)
            {
                if (compare(*current, *min))
                {
                    std::iter_swap(first, current);
                    min = first;
                }
                else if (not compare(*min, *current))
                {
                    ++min;
                    if (min != current)
                    {
                        std::iter_swap(min, current);
                    }
                }
            }

            return ++min;
        }

        return first;
    }